

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O2

string * __thiscall
arangodb::velocypack::HexDump::toHex_abi_cxx11_
          (string *__return_storage_ptr__,HexDump *this,uint8_t value,string_view header)

{
  undefined7 in_register_00000011;
  allocator<char> local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = CONCAT71(in_register_00000011,value);
  local_28._M_str = (char *)header._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_28,&local_29);
  appendHex(__return_storage_ptr__,(uint8_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::string HexDump::toHex(uint8_t value, std::string_view header) {
  std::string result(header);
  appendHex(result, value);
  return result;
}